

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Code.cpp
# Opt level: O3

bool isValidCode(string *str)

{
  char cVar1;
  long lVar2;
  size_type sVar3;
  long lVar4;
  
  if (str->_M_string_length == 0) {
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    sVar3 = 0;
    do {
      cVar1 = (str->_M_dataplus)._M_p[sVar3];
      lVar4 = -(ulong)(cVar1 == ')');
      if (cVar1 == '(') {
        lVar4 = 1;
      }
      lVar2 = lVar2 + lVar4;
      sVar3 = sVar3 + 1;
    } while (str->_M_string_length != sVar3);
    if (lVar2 < 0) {
      __assert_fail("count >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Final/src/Code.cpp"
                    ,0x11,"bool isValidCode(std::string &)");
    }
  }
  return lVar2 == 0;
}

Assistant:

bool isValidCode(std::string &str) {
    unsigned long i = 0;
    long count = 0;
    for (i = 0; i < str.length(); i++) {
        if (str[i] == '(') {
            count++;
        } else if (str[i] == ')') {
            count--;
        }
    }
    assert(count >= 0);
    if (count == 0) {
        return true;
    } else if (count > 0) {
        return false;
    }
}